

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorDynSize.cpp
# Opt level: O0

VectorDynSize * __thiscall
iDynTree::VectorDynSize::operator=(VectorDynSize *this,Span<const_double,__1L> vec)

{
  size_t sVar1;
  size_t sVar2;
  pointer __src;
  VectorDynSize *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  VectorDynSize *in_stack_ffffffffffffffd0;
  double *__dest;
  
  sVar1 = in_RDI->m_size;
  sVar2 = Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x7735a0);
  if (sVar1 != sVar2) {
    Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x7735b7);
    resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (in_RDI->m_size != 0) {
    __dest = in_RDI->m_data;
    __src = Span<const_double,_-1L>::data((Span<const_double,__1L> *)0x7735e8);
    memcpy(__dest,__src,in_RDI->m_size << 3);
  }
  return in_RDI;
}

Assistant:

VectorDynSize &VectorDynSize::operator=(Span<const double> vec)
{
    // if the size don't match, reallocate the data
    if( this->m_size != vec.size() )
    {
        resize(static_cast<std::size_t>(vec.size()));
    }

    // After reallocation, the size should match
    assert(this->m_size == vec.size());

    // Copy data if the size is not 0
    if( this->m_size > 0 )
    {
        std::memcpy(this->m_data, vec.data(), this->m_size*sizeof(double));
    }

    return *this;
}